

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O2

bool __thiscall
PSEngine::get_move_destination_coord
          (PSEngine *this,PSVector2i p_origin,ObjectMoveType p_move_type,
          PSVector2i *p_out_destination)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  allocator<char> local_51;
  string local_50 [32];
  string local_30 [32];
  
  iVar4 = p_origin.y;
  switch(p_move_type) {
  case Up:
    iVar4 = iVar4 + -1;
    break;
  case Down:
    iVar4 = iVar4 + 1;
    break;
  case Left:
    p_origin.x = p_origin.x - 1;
    p_origin.y = 0;
    break;
  case Right:
    p_origin.x = p_origin.x + 1;
    p_origin.y = 0;
    break;
  default:
    if ((int)(this->m_config).log_verbosity < 5) {
      peVar1 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__cxx11::string::string(local_30,(string *)&m_engine_log_cat_abi_cxx11_);
      std::__cxx11::string::string<std::allocator<char>>
                (local_50,"incorrect move type specified to PSEngine::get_move_destination_cell",
                 &local_51);
      (*peVar1->_vptr_PSLogger[2])(peVar1,4,local_30,local_50);
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::~string(local_30);
      if ((this->m_config).log_operation_history_after_error == true) {
        print_operation_history(this);
      }
    }
    return false;
  }
  iVar3 = p_origin.x;
  bVar2 = false;
  if ((-1 < iVar3) && (iVar3 < (this->m_current_level).size.x)) {
    bVar2 = false;
    if ((-1 < iVar4) && (bVar2 = false, iVar4 < (this->m_current_level).size.y)) {
      p_out_destination->x = iVar3;
      p_out_destination->y = iVar4;
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool PSEngine::get_move_destination_coord(PSVector2i p_origin, ObjectMoveType p_move_type, PSVector2i& p_out_destination)
{
    switch (p_move_type)
    {
        case ObjectMoveType::Up:
            p_origin.y -= 1;
            break;
        case ObjectMoveType::Down:
            p_origin.y += 1;
            break;
        case ObjectMoveType::Left:
            p_origin.x -= 1;
            break;
        case ObjectMoveType::Right:
            p_origin.x += 1;
            break;

        default:
            PS_LOG_ERROR("incorrect move type specified to PSEngine::get_move_destination_cell");
            return false;
    }

    //check for out of bounds
    if(p_origin.x >= m_current_level.size.x || p_origin.x < 0 || p_origin.y >= m_current_level.size.y || p_origin.y < 0)
    {
        //PS_LOG_ERROR("Cannot get move destination cell since the move would be out of bounds");
        return false;
    }

    p_out_destination = p_origin;
    return true;
}